

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void update_ext_partition_context
               (MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE subsize,BLOCK_SIZE bsize,
               PARTITION_TYPE partition)

{
  byte bVar1;
  BLOCK_SIZE subsize_00;
  uint uVar2;
  
  if (BLOCK_8X4 < bsize) {
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
    subsize_00 = get_partition_subsize(bsize,'\x03');
    if (partition < 10) {
      uVar2 = (uint)(bVar1 >> 1);
      switch(partition) {
      case '\x03':
        if (bsize != BLOCK_8X8) {
          return;
        }
      default:
        subsize_00 = subsize;
        break;
      case '\x04':
        update_partition_context(xd,mi_row,mi_col,subsize_00,subsize);
        mi_row = uVar2 + mi_row;
        subsize_00 = subsize;
        bsize = subsize;
        break;
      case '\x05':
        update_partition_context(xd,mi_row,mi_col,subsize,subsize);
        mi_row = uVar2 + mi_row;
        bsize = subsize;
        break;
      case '\x06':
        update_partition_context(xd,mi_row,mi_col,subsize_00,subsize);
        mi_col = uVar2 + mi_col;
        subsize_00 = subsize;
        bsize = subsize;
        break;
      case '\a':
        update_partition_context(xd,mi_row,mi_col,subsize,subsize);
        mi_col = uVar2 + mi_col;
        bsize = subsize;
      }
      update_partition_context(xd,mi_row,mi_col,subsize_00,bsize);
      return;
    }
  }
  return;
}

Assistant:

static inline void update_ext_partition_context(MACROBLOCKD *xd, int mi_row,
                                                int mi_col, BLOCK_SIZE subsize,
                                                BLOCK_SIZE bsize,
                                                PARTITION_TYPE partition) {
  if (bsize >= BLOCK_8X8) {
    const int hbs = mi_size_wide[bsize] / 2;
    BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
    switch (partition) {
      case PARTITION_SPLIT:
        if (bsize != BLOCK_8X8) break;
        AOM_FALLTHROUGH_INTENDED;
      case PARTITION_NONE:
      case PARTITION_HORZ:
      case PARTITION_VERT:
      case PARTITION_HORZ_4:
      case PARTITION_VERT_4:
        update_partition_context(xd, mi_row, mi_col, subsize, bsize);
        break;
      case PARTITION_HORZ_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, subsize, subsize);
        break;
      case PARTITION_HORZ_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, bsize2, subsize);
        break;
      case PARTITION_VERT_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, subsize, subsize);
        break;
      case PARTITION_VERT_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, bsize2, subsize);
        break;
      default: assert(0 && "Invalid partition type");
    }
  }
}